

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetLinkLine
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  pointer *__ptr;
  string *l;
  cmOutputConverter *pcVar6;
  pointer pbVar7;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  string rl;
  string cbd;
  string linkPath;
  string linkFlags;
  string linkLibraries;
  string frameworkPath;
  string flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lopts;
  
  if (this->TagType != INTERGRITY_APPLICATION) {
    linkLibraries._M_dataplus._M_p = (pointer)&linkLibraries.field_2;
    linkLibraries._M_string_length = 0;
    linkLibraries.field_2._M_local_buf[0] = '\0';
    flags._M_dataplus._M_p = (pointer)&flags.field_2;
    flags._M_string_length = 0;
    flags.field_2._M_local_buf[0] = '\0';
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    frameworkPath._M_string_length = 0;
    frameworkPath.field_2._M_local_buf[0] = '\0';
    linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
    linkPath._M_string_length = 0;
    linkPath.field_2._M_local_buf[0] = '\0';
    this_00 = &this->LocalGenerator->super_cmLocalGenerator;
    pcVar1 = this_00->GlobalGenerator;
    pcVar6 = &this_00->super_cmOutputConverter;
    if (this_00 == (cmLocalGenerator *)0x0) {
      pcVar6 = (cmOutputConverter *)0x0;
    }
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&rl,this_00);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&cbd,(cmStateSnapshot *)&rl);
    (*pcVar1->_vptr_cmGlobalGenerator[0x10])(&linkLineComputer,pcVar1,pcVar6,&cbd);
    cmLocalGenerator::GetTargetFlags
              (&this->LocalGenerator->super_cmLocalGenerator,
               (cmLinkLineComputer *)
               linkLineComputer._M_t.
               super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
               .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl,config,
               &linkLibraries,&flags,&linkFlags,&frameworkPath,&linkPath,this->GeneratorTarget);
    cmSystemTools::ParseArguments(&lopts,&linkFlags);
    if (lopts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lopts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = lopts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    ",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        cbd._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&cbd,1);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != lopts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmSystemTools::ParseArguments(&lpath,&linkPath);
    for (; lpath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           lpath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        lpath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             lpath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(fout,"    -L\"",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,((lpath.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                          (lpath.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    }
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    cbd._M_dataplus._M_p = (pointer)&cbd.field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cbd,pcVar2,pcVar2 + psVar5->_M_string_length);
    cmSystemTools::ParseArguments(&llibs,&linkLibraries);
    for (psVar5 = llibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 != llibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      iVar3 = std::__cxx11::string::compare((ulong)psVar5,0,&DAT_00000002);
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    \"",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&rl,psVar5,&cbd);
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    -l\"",7);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,rl._M_dataplus._M_p,rl._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)rl._M_dataplus._M_p != &rl.field_2) {
          operator_delete(rl._M_dataplus._M_p,rl.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cbd._M_dataplus._M_p != &cbd.field_2) {
      operator_delete(cbd._M_dataplus._M_p,cbd.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lpath);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lopts);
    if ((__uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>)
        linkLineComputer._M_t.
        super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>._M_t.
        super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>.
        super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>)0x0) {
      (**(code **)(*(long *)linkLineComputer._M_t.
                            super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                            .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 8))()
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
      operator_delete(linkPath._M_dataplus._M_p,
                      CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                               linkPath.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
      operator_delete(frameworkPath._M_dataplus._M_p,
                      CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                               frameworkPath.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
      operator_delete(linkFlags._M_dataplus._M_p,
                      CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                               linkFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != &flags.field_2) {
      operator_delete(flags._M_dataplus._M_p,
                      CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                               flags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLibraries._M_dataplus._M_p != &linkLibraries.field_2) {
      operator_delete(linkLibraries._M_dataplus._M_p,
                      CONCAT71(linkLibraries.field_2._M_allocated_capacity._1_7_,
                               linkLibraries.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetLinkLine(std::ostream& fout,
                                                    std::string const& config)
{
  if (this->TagType == GhsMultiGpj::INTERGRITY_APPLICATION) {
    return;
  }

  std::string linkLibraries;
  std::string flags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->GetTargetFlags(
    linkLineComputer.get(), config, linkLibraries, flags, linkFlags,
    frameworkPath, linkPath, this->GeneratorTarget);

  // write out link options
  std::vector<std::string> lopts = cmSystemTools::ParseArguments(linkFlags);
  for (const std::string& l : lopts) {
    fout << "    " << l << '\n';
  }

  // write out link search paths
  // must be quoted for paths that contain spaces
  std::vector<std::string> lpath = cmSystemTools::ParseArguments(linkPath);
  for (const std::string& l : lpath) {
    fout << "    -L\"" << l << "\"\n";
  }

  // write out link libs
  // must be quoted for filepaths that contains spaces
  std::string cbd = this->LocalGenerator->GetCurrentBinaryDirectory();

  std::vector<std::string> llibs =
    cmSystemTools::ParseArguments(linkLibraries);
  for (const std::string& l : llibs) {
    if (l.compare(0, 2, "-l") == 0) {
      fout << "    \"" << l << "\"\n";
    } else {
      std::string rl = cmSystemTools::CollapseFullPath(l, cbd);
      fout << "    -l\"" << rl << "\"\n";
    }
  }
}